

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

uint64_t __thiscall
kj::anon_unknown_123::AsyncTee::Buffer::consume
          (Buffer *this,ArrayPtr<unsigned_char> *readBuffer,size_t *minBytes)

{
  _Elt_pointer pAVar1;
  uchar *puVar2;
  size_t sVar3;
  uchar *__dest;
  size_t sVar4;
  uchar *puVar5;
  ulong __n;
  uint64_t unaff_R13;
  size_t __n_00;
  uint64_t uVar6;
  Array<unsigned_char> result;
  
  uVar6 = 0;
  while( true ) {
    __n = readBuffer->size_;
    if (__n == 0) {
      return uVar6;
    }
    pAVar1 = (this->bufferList).
             super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->bufferList).
        super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur == pAVar1) break;
    if (pAVar1->size_ < __n) {
      __n = pAVar1->size_;
    }
    memcpy(readBuffer->ptr,pAVar1->ptr,__n);
    uVar6 = uVar6 + __n;
    readBuffer->ptr = readBuffer->ptr + __n;
    readBuffer->size_ = readBuffer->size_ - __n;
    sVar4 = 0;
    if (__n <= *minBytes) {
      sVar4 = *minBytes - __n;
    }
    *minBytes = sVar4;
    sVar4 = pAVar1->size_;
    if (__n == sVar4) {
      std::deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::pop_front
                (&this->bufferList);
    }
    else {
      puVar2 = pAVar1->ptr;
      sVar3 = pAVar1->size_;
      __dest = (uchar *)kj::_::HeapArrayDisposer::allocateImpl
                                  (1,0,sVar3 - __n,(_func_void_void_ptr *)0x0,
                                   (_func_void_void_ptr *)0x0);
      __n_00 = sVar3 - __n;
      puVar5 = __dest;
      if (__n_00 != 0) {
        puVar5 = __dest + __n_00;
        memcpy(__dest,puVar2 + __n,__n_00);
      }
      puVar2 = pAVar1->ptr;
      if (puVar2 != (uchar *)0x0) {
        sVar3 = pAVar1->size_;
        pAVar1->ptr = (uchar *)0x0;
        pAVar1->size_ = 0;
        (**pAVar1->disposer->_vptr_ArrayDisposer)(pAVar1->disposer,puVar2,1,sVar3,sVar3,0);
      }
      pAVar1->ptr = __dest;
      pAVar1->size_ = (long)puVar5 - (long)__dest;
      pAVar1->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      unaff_R13 = uVar6;
    }
    if (__n != sVar4) {
      return unaff_R13;
    }
  }
  return uVar6;
}

Assistant:

uint64_t AsyncTee::Buffer::consume(ArrayPtr<byte>& readBuffer, size_t& minBytes) {
  uint64_t totalAmount = 0;

  while (readBuffer.size() > 0 && !bufferList.empty()) {
    auto& bytes = bufferList.front();
    auto amount = kj::min(bytes.size(), readBuffer.size());
    memcpy(readBuffer.begin(), bytes.begin(), amount);
    totalAmount += amount;

    readBuffer = readBuffer.slice(amount, readBuffer.size());
    minBytes -= kj::min(amount, minBytes);

    if (amount == bytes.size()) {
      bufferList.pop_front();
    } else {
      bytes = heapArray(bytes.slice(amount, bytes.size()));
      return totalAmount;
    }
  }

  return totalAmount;
}